

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O1

cl_int clReleaseCommandBufferKHR(cl_command_buffer_khr command_buffer)

{
  _Rb_tree_header *p_Var1;
  atomic<unsigned_long> *paVar2;
  bool bVar3;
  _func_cl_int_cl_command_buffer_khr *p_Var4;
  ulong enqueueCounter;
  CLIntercept *this;
  cl_uint cVar5;
  _Base_ptr p_Var6;
  mapped_type *pmVar7;
  time_point end;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  cl_int unaff_EBP;
  undefined8 in_stack_ffffffffffffff98;
  cl_command_buffer_khr p_Var10;
  undefined4 uVar11;
  time_point local_60;
  undefined1 local_50 [32];
  
  this = g_pIntercept;
  uVar11 = (undefined4)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x472;
  }
  p_Var1 = &(g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (g_pIntercept->m_CommandBufferInfoMap)._M_t._M_impl.super__Rb_tree_header._M_header.
           _M_parent;
  p_Var8 = &p_Var1->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0;
      p_Var6 = (&p_Var6->_M_left)[*(cl_command_buffer_khr *)(p_Var6 + 1) < command_buffer]) {
    if (*(cl_command_buffer_khr *)(p_Var6 + 1) >= command_buffer) {
      p_Var8 = p_Var6;
    }
  }
  p_Var6 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var8 != p_Var1) &&
     (p_Var6 = p_Var8, command_buffer < *(cl_command_buffer_khr *)(p_Var8 + 1))) {
    p_Var6 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var6 == p_Var1) {
    p_Var6 = (_Base_ptr)0x0;
  }
  else {
    p_Var6 = p_Var6[1]._M_parent;
  }
  p_Var1 = &(g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
  p_Var8 = (g_pIntercept->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var9 = &p_Var1->_M_header;
  for (; p_Var8 != (_Base_ptr)0x0; p_Var8 = (&p_Var8->_M_left)[*(_Base_ptr *)(p_Var8 + 1) < p_Var6])
  {
    if (*(_Base_ptr *)(p_Var8 + 1) >= p_Var6) {
      p_Var9 = p_Var8;
    }
  }
  p_Var8 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var9 != p_Var1) &&
     (p_Var8 = p_Var9, p_Var6 < *(_Base_ptr *)(p_Var9 + 1))) {
    p_Var8 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var8 == p_Var1) {
    local_50._0_8_ = (key_type)0x0;
    pmVar7 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&g_pIntercept->m_DispatchX,(key_type *)local_50);
  }
  else {
    pmVar7 = (mapped_type *)&p_Var8[1]._M_parent;
  }
  p_Var4 = pmVar7->clReleaseCommandBufferKHR;
  if (p_Var4 == (_func_cl_int_cl_command_buffer_khr *)0x0) goto LAB_0013fe37;
  enqueueCounter = (this->m_EnqueueCounter).super___atomic_base<unsigned_long>._M_i;
  cVar5 = 0;
  if ((this->m_Config).CallLogging == true) {
    cVar5 = CLIntercept::getRefCount(this,command_buffer);
  }
  if ((this->m_Config).CallLogging == true) {
    p_Var10 = command_buffer;
    CLIntercept::callLoggingEnter
              (this,"clReleaseCommandBufferKHR",enqueueCounter,(cl_kernel)0x0,
               "[ ref count = %d ] command_buffer = %p",(ulong)cVar5,command_buffer);
    uVar11 = (undefined4)((ulong)p_Var10 >> 0x20);
  }
  CLIntercept::checkRemoveCommandBufferInfo(this,command_buffer);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_60.__d.__r = (duration)0;
  }
  else {
    local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  unaff_EBP = (*pmVar7->clReleaseCommandBufferKHR)(command_buffer);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    end.__d.__r = (duration)0;
  }
  else {
    end.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= enqueueCounter &&
        (enqueueCounter <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_50._0_8_ = (key_type)(local_50 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
      CLIntercept::updateHostTimingStats
                (this,"clReleaseCommandBufferKHR",(string *)local_50,local_60,end);
      if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
        operator_delete((void *)local_50._0_8_);
      }
    }
  }
  bVar3 = (this->m_Config).ErrorLogging;
  if ((bVar3 == false) && ((this->m_Config).ErrorAssert == false)) {
    if ((unaff_EBP != 0) && ((this->m_Config).NoErrors != false)) {
LAB_0013fd65:
      if (bVar3 != false) {
        CLIntercept::logError(this,"clReleaseCommandBufferKHR",unaff_EBP);
      }
      if ((this->m_Config).ErrorAssert == true) {
        raise(5);
      }
      if ((this->m_Config).NoErrors != false) {
        unaff_EBP = 0;
      }
    }
  }
  else {
    if (unaff_EBP != 0) goto LAB_0013fd65;
    unaff_EBP = 0;
  }
  if ((command_buffer != (cl_command_buffer_khr)0x0) && ((this->m_Config).LeakChecking != false)) {
    LOCK();
    paVar2 = &(this->m_ObjectTracker).m_CommandBuffers.NumReleases;
    (paVar2->super___atomic_base<unsigned_long>)._M_i =
         (paVar2->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clReleaseCommandBufferKHR",unaff_EBP,(cl_event *)0x0,(cl_sync_point_khr *)0x0,
               "[ ref count = %d ]",CONCAT44(uVar11,cVar5 - 1));
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_50._0_8_ = (key_type)(local_50 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clReleaseCommandBufferKHR",(string *)local_50,false,0,local_60,end);
    if ((key_type)local_50._0_8_ != (key_type)(local_50 + 0x10)) {
      operator_delete((void *)local_50._0_8_);
    }
  }
LAB_0013fe37:
  if (p_Var4 == (_func_cl_int_cl_command_buffer_khr *)0x0) {
    return -0x472;
  }
  return unaff_EBP;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clReleaseCommandBufferKHR(
    cl_command_buffer_khr command_buffer)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_buffer);
        if( dispatchX.clReleaseCommandBufferKHR )
        {
            GET_ENQUEUE_COUNTER();

            cl_uint ref_count =
                pIntercept->config().CallLogging ?
                pIntercept->getRefCount( command_buffer ) : 0;
            CALL_LOGGING_ENTER( "[ ref count = %d ] command_buffer = %p",
                ref_count,
                command_buffer );
            pIntercept->checkRemoveCommandBufferInfo( command_buffer );
            HOST_PERFORMANCE_TIMING_START();

            cl_int  retVal = dispatchX.clReleaseCommandBufferKHR(
                command_buffer );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            ADD_OBJECT_RELEASE( command_buffer );
            CALL_LOGGING_EXIT( retVal, "[ ref count = %d ]", --ref_count );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_BUFFER_KHR);
}